

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<const_QDBusPlatformMenuItem_*>::relocate
          (QArrayDataPointer<const_QDBusPlatformMenuItem_*> *this,qsizetype offset,
          QDBusPlatformMenuItem ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<const_QDBusPlatformMenuItem_*> *in_RDI;
  QDBusPlatformMenuItem ***unaff_retaddr;
  QDBusPlatformMenuItem **res;
  QDBusPlatformMenuItem **first;
  QArrayDataPointer<const_QDBusPlatformMenuItem_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QDBusPlatformMenuItem_const*,long_long>
            (first,(longlong)in_RDI,(QDBusPlatformMenuItem **)0xb1de67);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QDBusPlatformMenuItem_const*>,QDBusPlatformMenuItem_const*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }